

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTaskCostToGo::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  unsigned_long *in_RSI;
  search *in_RDI;
  uint32_t in_stack_000001bc;
  search *in_stack_000001c0;
  
  Search::search::set_options(in_stack_000001c0,in_stack_000001bc);
  Search::search::set_task_data<unsigned_long>(in_RDI,in_RSI);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& /*options*/)
{
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |     // please just use hamming loss on individual predictions -- we won't declare loss
      Search::EXAMPLES_DONT_CHANGE |  // we don't do any internal example munging
      Search::ACTION_COSTS |          // we'll provide cost-per-action (rather than oracle)
      0);
  sch.set_task_data<size_t>(&num_actions);
}